

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromFm(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  bool bVar1;
  int iVar2;
  string local_50;
  optional<metaf::MetafTime> time;
  
  if ((fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_), iVar2 != 0)
     ) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,"FM\\d\\d\\d\\d\\d\\d",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (s,&fromFm(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    MetafTime::fromStringDDHHMM(&time,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged != false) {
      local_50._M_string_length._0_5_ =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._0_5_;
      local_50._M_string_length._5_2_ =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._5_2_;
      local_50._M_string_length._7_1_ =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._7_1_;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._17_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._19_1_;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.prob = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup = false
      ;
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 9)
           = CONCAT53((undefined5)local_50._M_string_length,local_50._M_dataplus._M_p._5_3_);
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x11) =
           local_50._M_string_length._5_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x13) =
           local_50._M_string_length._7_1_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14) =
           time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
      *(bool *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c
               ) = time.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromFm(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("FM\\d\\d\\d\\d\\d\\d");
	static const auto posTime = 2, lenTime = 6;
	if (!regex_match(s, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(s.substr(posTime, lenTime));
	if (!time.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::FROM;
	result.tFrom = time;
	return result;
}